

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O3

bool __thiscall QNetworkCookie::operator==(QNetworkCookie *this,QNetworkCookie *other)

{
  QNetworkCookiePrivate *pQVar1;
  QNetworkCookiePrivate *pQVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QDateTime aQStack_38 [8];
  QDateTime local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar4 = true;
    goto LAB_00185e3e;
  }
  bVar4 = ::operator==(&pQVar2->name,&pQVar1->name);
  if (bVar4) {
    bVar4 = ::operator==(&((this->d).d.ptr)->value,&((other->d).d.ptr)->value);
    if (bVar4) {
      QDateTime::toUTC();
      QDateTime::toUTC();
      cVar5 = QDateTime::equals(local_30);
      if (cVar5 == '\0') {
LAB_00185e2a:
        bVar4 = false;
      }
      else {
        pQVar1 = (this->d).d.ptr;
        pQVar2 = (other->d).d.ptr;
        lVar3 = (pQVar1->domain).d.size;
        if (lVar3 != (pQVar2->domain).d.size) goto LAB_00185e2a;
        QVar6.m_data = (pQVar1->domain).d.ptr;
        QVar6.m_size = lVar3;
        QVar9.m_data = (pQVar2->domain).d.ptr;
        QVar9.m_size = lVar3;
        cVar5 = QtPrivate::equalStrings(QVar6,QVar9);
        if ((cVar5 == '\0') || (lVar3 = (pQVar1->path).d.size, lVar3 != (pQVar2->path).d.size))
        goto LAB_00185e2a;
        QVar7.m_data = (pQVar1->path).d.ptr;
        QVar7.m_size = lVar3;
        QVar10.m_data = (pQVar2->path).d.ptr;
        QVar10.m_size = lVar3;
        cVar5 = QtPrivate::equalStrings(QVar7,QVar10);
        if ((cVar5 == '\0') ||
           ((pQVar1->secure != pQVar2->secure ||
            (lVar3 = (pQVar1->comment).d.size, lVar3 != (pQVar2->comment).d.size))))
        goto LAB_00185e2a;
        QVar8.m_data = (pQVar1->comment).d.ptr;
        QVar8.m_size = lVar3;
        QVar11.m_data = (pQVar2->comment).d.ptr;
        QVar11.m_size = lVar3;
        cVar5 = QtPrivate::equalStrings(QVar8,QVar11);
        if (cVar5 == '\0') goto LAB_00185e2a;
        bVar4 = pQVar1->sameSite == pQVar2->sameSite;
      }
      QDateTime::~QDateTime(aQStack_38);
      QDateTime::~QDateTime(local_30);
      goto LAB_00185e3e;
    }
  }
  bVar4 = false;
LAB_00185e3e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkCookie::operator==(const QNetworkCookie &other) const
{
    if (d == other.d)
        return true;
    return d->name == other.d->name &&
        d->value == other.d->value &&
        d->expirationDate.toUTC() == other.d->expirationDate.toUTC() &&
        d->domain == other.d->domain &&
        d->path == other.d->path &&
        d->secure == other.d->secure &&
        d->comment == other.d->comment &&
        d->sameSite == other.d->sameSite;
}